

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

void google::protobuf::compiler::java::WriteUInt32ToUtf16CharSequence
               (uint32_t number,vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  unsigned_short *__args;
  uint uVar1;
  iterator iVar3;
  unsigned_short local_1e;
  ushort local_1c;
  unsigned_short local_1a;
  ulong uVar2;
  
  uVar2 = (ulong)number;
  if (number < 0xd800) {
    local_1a = (unsigned_short)number;
    iVar3._M_current =
         (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_1a;
LAB_00250184:
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>(output,iVar3,__args);
      return;
    }
    *iVar3._M_current = local_1a;
  }
  else {
    do {
      uVar1 = (uint)uVar2;
      local_1c = (ushort)uVar2 | 0xe000;
      iVar3._M_current =
           (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(output,iVar3,&local_1c);
      }
      else {
        *iVar3._M_current = local_1c;
        (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar2 = uVar2 >> 0xd;
    } while (0x1affffff < uVar1);
    local_1e = (unsigned_short)uVar2;
    iVar3._M_current =
         (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_1e;
      goto LAB_00250184;
    }
    *iVar3._M_current = local_1e;
  }
  (output->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  return;
}

Assistant:

void WriteUInt32ToUtf16CharSequence(uint32_t number,
                                    std::vector<uint16_t>* output) {
  // For values in [0x0000, 0xD7FF], only use one char to encode it.
  if (number < 0xD800) {
    output->push_back(static_cast<uint16_t>(number));
    return;
  }
  // Encode into multiple chars. All except the last char will be in the range
  // [0xE000, 0xFFFF], and the last char will be in the range [0x0000, 0xD7FF].
  // Note that we don't use any value in range [0xD800, 0xDFFF] because they
  // have to come in pairs and the encoding is just more space-efficient w/o
  // them.
  while (number >= 0xD800) {
    // [0xE000, 0xFFFF] can represent 13 bits of info.
    output->push_back(static_cast<uint16_t>(0xE000 | (number & 0x1FFF)));
    number >>= 13;
  }
  output->push_back(static_cast<uint16_t>(number));
}